

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::~Vector
          (Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this)

{
  Entry *pEVar1;
  RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *pRVar2;
  Entry *pEVar3;
  ArrayDisposer *pAVar4;
  
  pEVar1 = (this->builder).ptr;
  if (pEVar1 != (Entry *)0x0) {
    pRVar2 = (this->builder).pos;
    pEVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Entry *)0x0;
    (this->builder).pos =
         (RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0;
    (this->builder).endPtr = (Entry *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pEVar1,0x10,(long)pRVar2 - (long)pEVar1 >> 4,(long)pEVar3 - (long)pEVar1 >> 4,
               0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }